

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReactiveDevice.cpp
# Opt level: O3

void __thiscall
Apple::ADB::ReactiveDevice::adb_bus_did_observe_event
          (ReactiveDevice *this,Event event,uint8_t value)

{
  int iVar1;
  iterator __position;
  pointer puVar2;
  bool bVar3;
  ushort *puVar4;
  ushort *puVar5;
  ulong uVar6;
  Type TVar7;
  byte bVar8;
  ushort uVar9;
  initializer_list<unsigned_char> __l;
  byte local_2c;
  allocator_type local_2b;
  ushort local_2a;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_28;
  
  if (this->phase_ == AwaitingAttention) {
    if (event != Attention) {
      return;
    }
    this->phase_ = AwaitingCommand;
    return;
  }
  if (event != Byte) {
    return;
  }
  local_2c = value;
  if (this->phase_ == AwaitingContent) {
    __position._M_current =
         (this->content_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->content_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_char,std::allocator<unsigned_char>>::
      _M_realloc_insert<unsigned_char_const&>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)&this->content_,__position,
                 &local_2c);
      puVar4 = (ushort *)
               (this->content_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    }
    else {
      *__position._M_current = value;
      puVar4 = (ushort *)
               ((this->content_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_finish + 1);
      (this->content_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)puVar4;
    }
    puVar5 = (ushort *)
             (this->content_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((long)puVar4 - (long)puVar5 == this->expected_content_size_) {
      this->phase_ = AwaitingAttention;
      if ((this->command_).reg == '\x03') {
        this->register3_ = *puVar5 << 8 | *puVar5 >> 8;
      }
      else {
        (*(this->super_Device)._vptr_Device[3])(this,&this->command_,&this->content_);
        puVar5 = (ushort *)
                 (this->content_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        puVar4 = (ushort *)
                 (this->content_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      }
      if (puVar4 != puVar5) {
        (this->content_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)puVar5;
      }
    }
  }
  if (this->phase_ != AwaitingCommand) {
    return;
  }
  this->phase_ = AwaitingAttention;
  TVar7 = Reserved;
  uVar6 = 0xff;
  bVar3 = false;
  switch(local_2c & 0xf) {
  case 0:
    bVar3 = false;
    bVar8 = 0xff;
    TVar7 = Reset;
    break;
  case 1:
    bVar8 = local_2c >> 4;
    TVar7 = Flush;
    bVar3 = false;
    break;
  default:
    bVar8 = 0xff;
    break;
  case 8:
  case 9:
  case 10:
  case 0xb:
    TVar7 = Listen;
    bVar3 = false;
    goto LAB_00265c80;
  case 0xc:
  case 0xd:
  case 0xe:
  case 0xf:
    TVar7 = Talk;
    bVar3 = true;
LAB_00265c80:
    bVar8 = local_2c >> 4;
    uVar6 = (ulong)(local_2c & 3);
  }
  uVar9 = (ushort)bVar8 | (ushort)((uVar6 << 0x28) >> 0x20);
  (this->command_).type = TVar7;
  (this->command_).device = (char)uVar9;
  (this->command_).reg = (char)(uVar9 >> 8);
  if ((bVar8 == 0xff) || ((*(byte *)((long)&this->register3_ + 1) & 0xf) == bVar8)) {
    if (TVar7 - Listen < 2) {
      if ((char)uVar6 == '\x03') {
        if (!bVar3) {
          puVar2 = (this->content_).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start;
          if ((this->content_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_finish != puVar2) {
            (this->content_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_finish = puVar2;
          }
          this->expected_content_size_ = 2;
          this->phase_ = AwaitingContent;
          return;
        }
        local_2a = this->register3_ << 8 | this->register3_ >> 8;
        __l._M_len = 2;
        __l._M_array = (iterator)&local_2a;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_28,__l,&local_2b);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                  (&this->response_,&local_28);
        this->microseconds_at_bit_ = 0.0;
        this->bit_offset_ = -2;
        if (local_28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start == (pointer)0x0) {
          return;
        }
        operator_delete(local_28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_28.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_28.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
        return;
      }
      LOCK();
      (this->service_desired_)._M_base._M_i = false;
      UNLOCK();
    }
    else if (TVar7 == Reset) {
      iVar1._0_1_ = this->default_adb_device_id_;
      iVar1._1_1_ = this->service_desired_;
      iVar1._2_2_ = *(undefined2 *)&this->field_0x76;
      this->register3_ = (ushort)(iVar1 << 8) | 0x6001;
    }
    (*(this->super_Device)._vptr_Device[2])(this,&this->command_);
  }
  else if (((this->service_desired_)._M_base._M_i & 1U) != 0) {
    LOCK();
    (this->service_desired_)._M_base._M_i = false;
    UNLOCK();
    this->stop_has_begin_ = false;
    this->phase_ = ServiceRequestPending;
    this->microseconds_at_bit_ = 0.0;
  }
  return;
}

Assistant:

void ReactiveDevice::adb_bus_did_observe_event(Bus::Event event, uint8_t value) {
	if(phase_ == Phase::AwaitingAttention) {
		if(event != Bus::Event::Attention) return;
		phase_ = Phase::AwaitingCommand;
		return;
	}

	if(event != Bus::Event::Byte) return;

	if(phase_ == Phase::AwaitingContent) {
		content_.push_back(value);
		if(content_.size() == expected_content_size_) {
			phase_ = Phase::AwaitingAttention;

			if(command_.reg == 3) {
				register3_ = uint16_t((content_[0] << 8) | content_[1]);
			} else {
				did_receive_data(command_, content_);
			}
			content_.clear();
		}
	}

	if(phase_ == Phase::AwaitingCommand) {
		phase_ = Phase::AwaitingAttention;

		command_ = decode_command(value);
//		logger.info().append("%d", command_);

		// If this command doesn't apply here, but a service request is requested,
		// post a service request.
		if(command_.device != Command::AllDevices && command_.device != ((register3_ >> 8) & 0xf)) {
			if(service_desired_) {
				service_desired_ = false;
				stop_has_begin_ = false;
				phase_ = Phase::ServiceRequestPending;
				microseconds_at_bit_ = 0.0;
			}
			return;
		}

		// Handle reset and register 3 here automatically; pass everything else along.
		switch(command_.type) {
			case Command::Type::Reset:
				reset();
			[[fallthrough]];
			default:
				perform_command(command_);
			break;

			case Command::Type::Listen:
			case Command::Type::Talk:
				if(command_.reg == 3) {
					if(command_.type == Command::Type::Talk) {
						post_response({uint8_t(register3_ >> 8), uint8_t(register3_ & 0xff)});
					} else {
						receive_bytes(2);
					}
				} else {
					service_desired_ = false;
					perform_command(command_);
				}
			break;
		}
	}
}